

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Token * __thiscall wabt::WastParser::TokenQueue::at(TokenQueue *this,size_t n)

{
  const_reference this_00;
  Token *pTVar1;
  size_t n_local;
  TokenQueue *this_local;
  
  if (n < 2) {
    this_00 = std::array<std::optional<wabt::Token>,_2UL>::operator[]
                        (&this->tokens,(long)(int)(uint)(this->i & 1U ^ n != 0));
    pTVar1 = std::optional<wabt::Token>::value(this_00);
    return pTVar1;
  }
  __assert_fail("n <= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                ,0xf29,"const Token &wabt::WastParser::TokenQueue::at(size_t) const");
}

Assistant:

const Token& WastParser::TokenQueue::at(size_t n) const {
  assert(n <= 1);
  return tokens[i ^ static_cast<bool>(n)].value();
}